

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int JS_IsArray(JSContext *ctx,JSValue val)

{
  JSValue obj;
  uint uVar1;
  undefined8 in_RDX;
  JSContext *in_RSI;
  JSObject *p;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if ((int)in_RDX == -1) {
    if ((in_RSI->header).dummy2 == 0x29) {
      obj.tag._0_4_ = in_stack_fffffffffffffff8;
      obj.u = (JSValueUnion)in_RDX;
      obj.tag._4_4_ = in_stack_fffffffffffffffc;
      uVar1 = js_proxy_isArray(in_RSI,obj);
    }
    else {
      uVar1 = (uint)((in_RSI->header).dummy2 == 2);
    }
  }
  else {
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

int JS_IsArray(JSContext *ctx, JSValueConst val)
{
    JSObject *p;
    if (JS_VALUE_GET_TAG(val) == JS_TAG_OBJECT) {
        p = JS_VALUE_GET_OBJ(val);
        if (unlikely(p->class_id == JS_CLASS_PROXY))
            return js_proxy_isArray(ctx, val);
        else
            return p->class_id == JS_CLASS_ARRAY;
    } else {
        return FALSE;
    }
}